

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::write_hashes
          (bt_peer_connection *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  _Atomic_word *p_Var1;
  int iVar2;
  file_index_t index;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _func_int *p_Var7;
  element_type *this_00;
  counters *this_01;
  byte bVar8;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  uint val;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  digest32<256L> *pdVar20;
  ulong uVar21;
  digest32<256L> *pdVar22;
  char *pcVar23;
  ulong uVar24;
  element_type *peVar25;
  digest32<256L> *h;
  uint uVar26;
  bool bVar27;
  span<const_char> buf;
  undefined1 auStack_78 [8];
  sha256_hash root;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  lVar19 = hashes.m_len;
  pdVar20 = hashes.m_ptr;
  pcVar23 = auStack_78;
  iVar16 = (int)hashes.m_len * 0x20;
  uVar26 = iVar16 + 0x35;
  uVar24 = (ulong)(int)uVar26;
  root.m_number._M_elems._24_8_ = lVar19;
  if ((long)uVar24 < 0x1001) {
    if ((int)uVar26 < 1) {
      uVar24 = 0;
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar23 = (char *)((long)&root + (-8 - (ulong)((uVar26 & 0x7ffffff5) + 0xf & 0xfffffff0)));
      pcVar17 = pcVar23;
    }
  }
  else {
    pcVar17 = (char *)operator_new__(uVar24);
    pcVar23 = auStack_78;
  }
  uVar26 = iVar16 + 0x31;
  uVar13 = (ushort)((uVar26 & 0xff00ff) >> 0x10);
  uVar14 = (ushort)(uVar26 >> 8) & 0xff;
  uVar15 = (ushort)(uVar26 & 0xff00ff);
  bVar9 = (byte)(uVar26 >> 0x18);
  uVar12 = (ushort)bVar9;
  bVar8 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
  bVar9 = ((uVar26 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar26 >> 0x10) - (0xff < uVar13);
  bVar10 = ((uVar26 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar14);
  bVar11 = ((uVar26 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar26 - (0xff < uVar15);
  *(uint *)pcVar17 =
       CONCAT13((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                         CONCAT11((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                                  (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
  pcVar17[4] = '\x16';
  p_Var6 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar25 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
    }
    iVar16 = p_Var6->_M_use_count;
    do {
      if (iVar16 == 0) {
        local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar25 = (element_type *)0x0;
        goto LAB_0018b2e4;
      }
      LOCK();
      iVar2 = p_Var6->_M_use_count;
      bVar27 = iVar16 == iVar2;
      if (bVar27) {
        p_Var6->_M_use_count = iVar16 + 1;
        iVar2 = iVar16;
      }
      iVar16 = iVar2;
      UNLOCK();
    } while (!bVar27);
    local_38 = p_Var6;
    if (p_Var6->_M_use_count == 0) {
      peVar25 = (element_type *)0x0;
    }
LAB_0018b2e4:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar16 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar16 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar16 + -1;
    }
    if (iVar16 == 1) {
      p_Var7 = p_Var6->_vptr__Sp_counted_base[3];
      pcVar23[-8] = '\t';
      pcVar23[-7] = -0x4d;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      (*p_Var7)();
    }
    if (peVar25 != (element_type *)0x0) {
      this_00 = (peVar25->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      index.m_val = (req->file).m_val;
      pcVar23[-8] = '*';
      pcVar23[-7] = -0x4d;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      file_storage::root((sha256_hash *)auStack_78,&this_00->m_files,index);
      *(undefined8 *)(pcVar17 + 0x15) = root.m_number._M_elems._8_8_;
      *(undefined8 *)(pcVar17 + 0x1d) = root.m_number._M_elems._16_8_;
      *(undefined1 (*) [8])(pcVar17 + 5) = auStack_78;
      *(undefined8 *)(pcVar17 + 0xd) = root.m_number._M_elems._0_8_;
      uVar26 = req->base;
      uVar13 = (ushort)(uVar26 >> 0x10) & 0xff;
      uVar14 = (ushort)(uVar26 >> 8) & 0xff;
      uVar15 = (ushort)uVar26 & 0xff;
      bVar9 = (byte)(uVar26 >> 0x18);
      uVar12 = (ushort)bVar9;
      bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
      bVar10 = ((uVar26 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar26 >> 0x10) -
               (0xff < uVar13);
      bVar11 = ((uVar26 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar14);
      bVar8 = ((uVar26 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar26 - (0xff < uVar15);
      *(uint *)(pcVar17 + 0x25) =
           CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                    CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                             CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                      (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
      uVar26 = req->index;
      uVar13 = (ushort)(uVar26 >> 0x10) & 0xff;
      uVar14 = (ushort)(uVar26 >> 8) & 0xff;
      uVar15 = (ushort)uVar26 & 0xff;
      bVar9 = (byte)(uVar26 >> 0x18);
      uVar12 = (ushort)bVar9;
      bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
      bVar10 = ((uVar26 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar26 >> 0x10) -
               (0xff < uVar13);
      bVar11 = ((uVar26 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar14);
      bVar8 = ((uVar26 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar26 - (0xff < uVar15);
      *(uint *)(pcVar17 + 0x29) =
           CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                    CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                             CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                      (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
      uVar26 = req->count;
      uVar13 = (ushort)(uVar26 >> 0x10) & 0xff;
      uVar14 = (ushort)(uVar26 >> 8) & 0xff;
      uVar15 = (ushort)uVar26 & 0xff;
      bVar9 = (byte)(uVar26 >> 0x18);
      uVar12 = (ushort)bVar9;
      bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
      bVar8 = ((uVar26 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar26 >> 0x10) -
              (0xff < uVar13);
      bVar11 = ((uVar26 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar14);
      bVar10 = ((uVar26 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar26 - (0xff < uVar15);
      *(uint *)(pcVar17 + 0x2d) =
           CONCAT13((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                    CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                             CONCAT11((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                      (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
      uVar26 = req->proof_layers;
      uVar13 = (ushort)(uVar26 >> 0x10) & 0xff;
      uVar14 = (ushort)(uVar26 >> 8) & 0xff;
      uVar15 = (ushort)uVar26 & 0xff;
      bVar9 = (byte)(uVar26 >> 0x18);
      uVar12 = (ushort)bVar9;
      bVar9 = (uVar12 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12);
      bVar10 = ((uVar26 & 0xff0000) != 0) * (uVar13 < 0x100) * (char)(uVar26 >> 0x10) -
               (0xff < uVar13);
      bVar11 = ((uVar26 & 0xff00) != 0) * (uVar14 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar14);
      bVar8 = ((uVar26 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar26 - (0xff < uVar15);
      *(uint *)(pcVar17 + 0x31) =
           CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                    CONCAT12((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11),
                             CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                      (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
      if (root.m_number._M_elems._24_8_ != 0) {
        pdVar22 = pdVar20 + lVar19;
        pcVar18 = pcVar17 + 0x35;
        do {
          uVar21 = 0x21;
          lVar19 = 0;
          do {
            pcVar18[lVar19] = *(char *)((long)(pdVar20->m_number)._M_elems + lVar19);
            uVar21 = uVar21 - 1;
            lVar19 = lVar19 + 1;
          } while (1 < uVar21);
          pdVar20 = pdVar20 + 1;
          pcVar18 = pcVar18 + lVar19;
        } while (pdVar20 != pdVar22);
      }
      this_01 = (this->super_peer_connection).m_counters;
      pcVar23[-8] = -0x7c;
      pcVar23[-7] = -0x4c;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      counters::inc_stats_counter(this_01,0x69,1);
      pcVar23[-8] = -0x6f;
      pcVar23[-7] = -0x4c;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      bVar27 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
      if (bVar27) {
        uVar26 = (req->file).m_val;
        uVar3 = req->base;
        uVar4 = req->index;
        uVar5 = req->count;
        *(ulong *)(pcVar23 + -0x10) = (ulong)(uint)req->proof_layers;
        *(ulong *)(pcVar23 + -0x18) = (ulong)uVar5;
        *(ulong *)(pcVar23 + -0x20) = (ulong)uVar4;
        pcVar23[-0x28] = -0x2e;
        pcVar23[-0x27] = -0x4c;
        pcVar23[-0x26] = '\x18';
        pcVar23[-0x25] = '\0';
        pcVar23[-0x24] = '\0';
        pcVar23[-0x23] = '\0';
        pcVar23[-0x22] = '\0';
        pcVar23[-0x21] = '\0';
        peer_connection::peer_log
                  (&this->super_peer_connection,outgoing_message,"HASHES",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar26,(ulong)uVar3);
      }
      pcVar23[-8] = -0x1b;
      pcVar23[-7] = -0x4c;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      buf.m_len = uVar24;
      buf.m_ptr = pcVar17;
      peer_connection::send_buffer(&this->super_peer_connection,buf);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar23[-8] = -9;
      pcVar23[-7] = -0x4c;
      pcVar23[-6] = '\x18';
      pcVar23[-5] = '\0';
      pcVar23[-4] = '\0';
      pcVar23[-3] = '\0';
      pcVar23[-2] = '\0';
      pcVar23[-1] = '\0';
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
  }
  if (0x1000 < (long)uVar24) {
    pcVar23[-8] = '\b';
    pcVar23[-7] = -0x4b;
    pcVar23[-6] = '\x18';
    pcVar23[-5] = '\0';
    pcVar23[-4] = '\0';
    pcVar23[-3] = '\0';
    pcVar23[-2] = '\0';
    pcVar23[-1] = '\0';
    operator_delete__(pcVar17);
  }
  return;
}

Assistant:

void bt_peer_connection::write_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		INVARIANT_CHECK;

		int const packet_size = int(5 + sha256_hash::size()
			+ 4 * 4
			+ sha256_hash::size() * hashes.size());
		TORRENT_ALLOCA(buf, char, packet_size);
		char* ptr = buf.data();
		aux::write_uint32(packet_size - 4, ptr);
		aux::write_uint8(msg_hashes, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		for (auto const& h : hashes)
			ptr = std::copy(h.begin(), h.end(), ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hashes);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}